

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<int>_&>::flattenTo
          (Delimited<kj::ArrayPtr<int>_&> *this,char *target,char *limit)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  int *elem;
  int *piVar7;
  char *pcVar8;
  char *__dest;
  char *local_58;
  CappedArray<char,_14UL> local_48;
  
  sVar1 = this->array->size_;
  if (sVar1 != 0) {
    piVar7 = this->array->ptr;
    piVar5 = piVar7 + sVar1;
    bVar3 = true;
    pcVar6 = target;
    do {
      __dest = pcVar6;
      pcVar2 = pcVar6;
      if (pcVar6 != limit) {
        if (bVar3) {
          bVar3 = false;
        }
        else {
          pcVar2 = (this->delimiter).content.ptr;
          sVar1 = (this->delimiter).content.size_;
          if (pcVar2 != pcVar2 + (sVar1 - 1)) {
            lVar4 = 1;
            do {
              *__dest = pcVar2[lVar4 + -1];
              __dest = __dest + 1;
              if ((2 - sVar1) + lVar4 == 1) break;
              lVar4 = lVar4 + 1;
            } while (__dest != limit);
          }
        }
        Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*piVar7);
        pcVar2 = local_58;
        if (__dest != limit && local_48.currentSize != 0) {
          pcVar8 = (char *)(local_48.currentSize - 1);
          if (limit + ~(ulong)__dest < (char *)(local_48.currentSize - 1)) {
            pcVar8 = limit + ~(ulong)__dest;
          }
          memcpy(__dest,local_48.content,(size_t)(pcVar8 + 1));
          __dest = __dest + (long)pcVar8 + 1;
        }
      }
      local_58 = pcVar2;
      target = local_58;
    } while ((pcVar6 != limit) &&
            (piVar7 = piVar7 + 1, pcVar6 = __dest, target = __dest, piVar7 != piVar5));
  }
  return target;
}

Assistant:

char* flattenTo(char* __restrict__ target, char* limit) {
    // This is called in the strPreallocated(). We want to avoid allocation. size() will not have
    // been called in this case, so hopefully `stringified` is still uninitialized. We will
    // stringify each item and immediately use it.
    bool first = true;
    for (auto&& elem: array) {
      if (target == limit) return target;
      if (first) {
        first = false;
      } else {
        target = fillLimited(target, limit, delimiter);
      }
      target = fillLimited(target, limit, kj::toCharSequence(elem));
    }
    return target;
  }